

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathConvertBoolean(xmlXPathObjectPtr val)

{
  int val_00;
  xmlXPathObjectPtr ret;
  xmlXPathObjectPtr val_local;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    val_local = xmlXPathNewBoolean(0);
  }
  else {
    val_local = val;
    if (val->type != XPATH_BOOLEAN) {
      val_00 = xmlXPathCastToBoolean(val);
      val_local = xmlXPathNewBoolean(val_00);
      xmlXPathFreeObject(val);
    }
  }
  return val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathConvertBoolean(xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(xmlXPathNewBoolean(0));
    if (val->type == XPATH_BOOLEAN)
	return(val);
    ret = xmlXPathNewBoolean(xmlXPathCastToBoolean(val));
    xmlXPathFreeObject(val);
    return(ret);
}